

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixml.c
# Opt level: O2

void ixmlPrintDomTreeRecursive(IXML_Node_conflict *nodeptr,ixml_membuf *buf)

{
  unsigned_short uVar1;
  char *pcVar2;
  char *pcVar3;
  IXML_Node_conflict *pIVar4;
  
LAB_00102aeb:
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    return;
  }
  pcVar2 = ixmlNode_getNodeName(nodeptr);
  pcVar3 = ixmlNode_getNodeValue(nodeptr);
  uVar1 = ixmlNode_getNodeType(nodeptr);
  switch(uVar1) {
  case 1:
    ixml_membuf_append_str(buf,"<");
    ixml_membuf_append_str(buf,pcVar2);
    if (nodeptr->firstAttr != (Nodeptr_conflict)0x0) {
      ixml_membuf_append_str(buf," ");
      ixmlPrintDomTreeRecursive(nodeptr->firstAttr,buf);
    }
    pIVar4 = ixmlNode_getFirstChild(nodeptr);
    if (pIVar4 == (IXML_Node_conflict *)0x0) {
LAB_00102b83:
      pcVar3 = ">";
    }
    else {
      uVar1 = ixmlNode_getNodeType(pIVar4);
      pcVar3 = ">\r\n";
      if (uVar1 != 1) goto LAB_00102b83;
    }
    ixml_membuf_append_str(buf,pcVar3);
    pIVar4 = ixmlNode_getFirstChild(nodeptr);
    ixmlPrintDomTreeRecursive(pIVar4,buf);
    ixml_membuf_append_str(buf,"</");
    ixml_membuf_append_str(buf,pcVar2);
    pIVar4 = ixmlNode_getNextSibling(nodeptr);
    if (pIVar4 == (IXML_Node_conflict *)0x0) {
LAB_00102be1:
      pcVar2 = ">\r\n";
    }
    else {
      uVar1 = ixmlNode_getNodeType(pIVar4);
      pcVar2 = ">";
      if (uVar1 != 3) goto LAB_00102be1;
    }
    ixml_membuf_append_str(buf,pcVar2);
    nodeptr = ixmlNode_getNextSibling(nodeptr);
    goto LAB_00102aeb;
  case 2:
    ixml_membuf_append_str(buf,pcVar2);
    ixml_membuf_append_str(buf,"=\"");
    copy_with_escape(buf,pcVar3);
    ixml_membuf_append_str(buf,"\"");
    if (nodeptr->nextSibling == (Nodeptr_conflict)0x0) {
      return;
    }
    ixml_membuf_append_str(buf," ");
    nodeptr = nodeptr->nextSibling;
    goto LAB_00102aeb;
  case 3:
    copy_with_escape(buf,pcVar3);
    return;
  case 4:
    ixml_membuf_append_str(buf,"<![CDATA[");
    ixml_membuf_append_str(buf,pcVar3);
    pcVar2 = "]]>";
    break;
  default:
    uVar1 = ixmlNode_getNodeType(nodeptr);
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixml.c",
               0xaf,"ixmlPrintDomTreeRecursive","Warning, unknown node type %d\n",(ulong)uVar1);
    return;
  case 7:
    ixml_membuf_append_str(buf,"<?");
    ixml_membuf_append_str(buf,pcVar2);
    ixml_membuf_append_str(buf," ");
    copy_with_escape(buf,pcVar3);
    pcVar2 = "?>\n";
    break;
  case 9:
    goto switchD_00102b27_caseD_9;
  }
  ixml_membuf_append_str(buf,pcVar2);
  return;
switchD_00102b27_caseD_9:
  nodeptr = ixmlNode_getFirstChild(nodeptr);
  goto LAB_00102aeb;
}

Assistant:

static void ixmlPrintDomTreeRecursive(
	/*! [in] \todo documentation. */
	IXML_Node *nodeptr,
	/*! [in] \todo documentation. */
	ixml_membuf *buf)
{
	const char *nodeName = NULL;
	const char *nodeValue = NULL;
	IXML_Node *child = NULL, *sibling = NULL;

	if (nodeptr != NULL) {
		nodeName = (const char *)ixmlNode_getNodeName(nodeptr);
		nodeValue = ixmlNode_getNodeValue(nodeptr);

		switch (ixmlNode_getNodeType(nodeptr)) {
		case eTEXT_NODE:
			copy_with_escape(buf, nodeValue);
			break;

		case eCDATA_SECTION_NODE:
			ixml_membuf_append_str(buf, "<![CDATA[");
			ixml_membuf_append_str(buf, nodeValue);
			ixml_membuf_append_str(buf, "]]>");
			break;

		case ePROCESSING_INSTRUCTION_NODE:
			ixml_membuf_append_str(buf, "<?");
			ixml_membuf_append_str(buf, nodeName);
			ixml_membuf_append_str(buf, " ");
			copy_with_escape(buf, nodeValue);
			ixml_membuf_append_str(buf, "?>\n");
			break;

		case eDOCUMENT_NODE:
			ixmlPrintDomTreeRecursive(
				ixmlNode_getFirstChild(nodeptr), buf);
			break;

		case eATTRIBUTE_NODE:
			ixml_membuf_append_str(buf, nodeName);
			ixml_membuf_append_str(buf, "=\"");
			copy_with_escape(buf, nodeValue);
			ixml_membuf_append_str(buf, "\"");
			if (nodeptr->nextSibling != NULL) {
				ixml_membuf_append_str(buf, " ");
				ixmlPrintDomTreeRecursive(
					nodeptr->nextSibling, buf);
			}
			break;

		case eELEMENT_NODE:
			ixml_membuf_append_str(buf, "<");
			ixml_membuf_append_str(buf, nodeName);
			if (nodeptr->firstAttr != NULL) {
				ixml_membuf_append_str(buf, " ");
				ixmlPrintDomTreeRecursive(
					nodeptr->firstAttr, buf);
			}
			child = ixmlNode_getFirstChild(nodeptr);
			if (child != NULL &&
				ixmlNode_getNodeType(child) == eELEMENT_NODE) {
				ixml_membuf_append_str(buf, ">\r\n");
			} else {
				ixml_membuf_append_str(buf, ">");
			}
			/* output the children */
			ixmlPrintDomTreeRecursive(
				ixmlNode_getFirstChild(nodeptr), buf);

			/* Done with children.  Output the end tag. */
			ixml_membuf_append_str(buf, "</");
			ixml_membuf_append_str(buf, nodeName);

			sibling = ixmlNode_getNextSibling(nodeptr);
			if (sibling != NULL &&
				ixmlNode_getNodeType(sibling) == eTEXT_NODE) {
				ixml_membuf_append_str(buf, ">");
			} else {
				ixml_membuf_append_str(buf, ">\r\n");
			}
			ixmlPrintDomTreeRecursive(
				ixmlNode_getNextSibling(nodeptr), buf);
			break;

		default:
			IxmlPrintf(__FILE__,
				__LINE__,
				"ixmlPrintDomTreeRecursive",
				"Warning, unknown node type %d\n",
				(int)ixmlNode_getNodeType(nodeptr));
			break;
		}
	}
}